

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lennard.c
# Opt level: O0

void check(int natoms)

{
  int in_EDI;
  int temp;
  
  gNblocks = (in_EDI / gBlockSize) * (in_EDI / gBlockSize);
  if (gBlockSize < 1) {
    GA_Error((char *)CONCAT44(natoms,temp),in_EDI);
  }
  if (in_EDI % gBlockSize != 0) {
    GA_Error((char *)CONCAT44(natoms,temp),in_EDI);
  }
  if (0x100 < gNblocks) {
    GA_Error((char *)CONCAT44(natoms,temp),in_EDI);
  }
  if (gNblocks < gNproc) {
    GA_Error((char *)CONCAT44(natoms,temp),in_EDI);
  }
  return;
}

Assistant:

void check(int natoms) {

  int temp = natoms/gBlockSize;
  gNblocks = temp * temp;

  if(gBlockSize <= 0) GA_Error("Invalid Block Size", gBlockSize);
  
  if(natoms%gBlockSize) {
    GA_Error("CHECK: # of atoms should be a multiple of block size. Chose a different block size.", 0L);
  } 
  
  if(gNblocks > MAX_BLOCKS)
    GA_Error("Number of blocks is greater than MAX_BLOCKS(512): Solution is either increase the defined MAX_BLOCKS or increase your block size", 0L); 
  
  if(gNblocks < gNproc)
    GA_Error("Number of blocks should be greater than number of processors",0L);
}